

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O2

bool mognetwork::deleteAll(Data *elem)

{
  if (elem != (Data *)0x0) {
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&elem->super__Vector_base<char,_std::allocator<char>_>);
  }
  operator_delete(elem);
  return true;
}

Assistant:

bool deleteAll(TcpSocket::Data* elem) {delete elem; return true;}